

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::assign(CImgList<unsigned_char> *this)

{
  CImg<unsigned_char> *pCVar1;
  uchar *puVar2;
  long lVar3;
  
  pCVar1 = this->_data;
  if (pCVar1 != (CImg<unsigned_char> *)0x0) {
    puVar2 = pCVar1[-1]._data;
    if (puVar2 != (uchar *)0x0) {
      lVar3 = (long)puVar2 << 5;
      do {
        CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)((long)&pCVar1[-1]._width + lVar3));
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != 0);
    }
    operator_delete__(&pCVar1[-1]._data,(long)puVar2 << 5 | 8);
  }
  this->_width = 0;
  this->_allocated_width = 0;
  this->_data = (CImg<unsigned_char> *)0x0;
  return this;
}

Assistant:

CImgList<T>& assign() {
      delete[] _data;
      _width = _allocated_width = 0;
      _data = 0;
      return *this;
    }